

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

bool __thiscall
duckdb::Value::TryCastAs
          (Value *this,CastFunctionSet *set,GetCastFunctionInput *get_input,LogicalType *target_type
          ,bool strict)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  string error_message;
  string local_a8;
  LogicalType local_88;
  Value local_70;
  
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value(&local_70,&local_88);
  LogicalType::~LogicalType(&local_88);
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  bVar3 = TryCastAs(this,set,get_input,target_type,&local_70,&local_a8,strict);
  if (bVar3) {
    if (this != (Value *)target_type) {
      (this->type_).id_ = target_type->id_;
      (this->type_).physical_type_ = target_type->physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(this->type_).type_info_,&target_type->type_info_);
    }
    _Var2._M_pi = local_70.value_info_.internal.
                  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    peVar1 = local_70.value_info_.internal.
             super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this->is_null = local_70.is_null;
    (this->value_).bigint = local_70.value_.bigint;
    (this->value_).hugeint.upper = local_70.value_.hugeint.upper;
    local_70.value_info_.internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_70.value_info_.internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->value_info_).internal.
              super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  ~Value(&local_70);
  return bVar3;
}

Assistant:

bool Value::TryCastAs(CastFunctionSet &set, GetCastFunctionInput &get_input, const LogicalType &target_type,
                      bool strict) {
	Value new_value;
	string error_message;
	if (!TryCastAs(set, get_input, target_type, new_value, &error_message, strict)) {
		return false;
	}
	type_ = target_type;
	is_null = new_value.is_null;
	value_ = new_value.value_;
	value_info_ = std::move(new_value.value_info_);
	return true;
}